

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O0

void __thiscall ipx::Basis::UnfreeVariables(Basis *this)

{
  Int IVar1;
  Int IVar2;
  reference pvVar3;
  long in_RDI;
  Int j;
  Int n;
  Int m;
  undefined4 local_14;
  
  IVar1 = Model::rows(*(Model **)(in_RDI + 8));
  IVar2 = Model::cols(*(Model **)(in_RDI + 8));
  for (local_14 = 0; local_14 < IVar2 + IVar1; local_14 = local_14 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x28),(long)local_14);
    if (IVar1 <= *pvVar3) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x28),(long)local_14);
      *pvVar3 = *pvVar3 - IVar1;
    }
  }
  return;
}

Assistant:

void Basis::UnfreeVariables() {
    const Int m = model_.rows();
    const Int n = model_.cols();
    for (Int j = 0; j < n+m; j++)
        if (map2basis_[j] >= m)
            map2basis_[j] -= m;
}